

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O0

int Llb_ManComputeBestAttr(Llb_Mtr_t *p)

{
  float fVar1;
  uint local_24;
  uint local_20;
  int RetValue;
  int k;
  int i;
  float WeightCur;
  float WeightBest;
  Llb_Mtr_t *p_local;
  
  i = -0x383cb000;
  local_24 = 0xffffffff;
  for (RetValue = 1; local_20 = RetValue, RetValue < p->nCols + -1; RetValue = RetValue + 1) {
    while (local_20 = local_20 + 1, (int)local_20 < p->nCols + -1) {
      if ((((p->pColSums[RetValue] != 0) && (p->pColSums[RetValue] <= p->pMan->pPars->nClusterMax))
          && (p->pColSums[(int)local_20] != 0)) &&
         ((p->pColSums[(int)local_20] <= p->pMan->pPars->nClusterMax &&
          (fVar1 = Llb_ManComputeCommonAttr(p,RetValue,local_20), (float)i < fVar1)))) {
        local_24 = RetValue << 0x10 | local_20;
        i = (int)fVar1;
      }
    }
  }
  return local_24;
}

Assistant:

int Llb_ManComputeBestAttr( Llb_Mtr_t * p )
{
    float WeightBest = -100000, WeightCur;
    int i, k, RetValue = -1;
    for ( i = 1; i < p->nCols-1; i++ )
    for ( k = i+1; k < p->nCols-1; k++ )
    {
        if ( p->pColSums[i] == 0 || p->pColSums[i] > p->pMan->pPars->nClusterMax )
            continue;
        if ( p->pColSums[k] == 0 || p->pColSums[k] > p->pMan->pPars->nClusterMax )
            continue;
        WeightCur = Llb_ManComputeCommonAttr( p, i, k );
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            RetValue   = (i << 16) | k;
        }
    }
    return RetValue;
}